

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O0

void __thiscall
SerialTaskRunner::ProcessQueue::RAIICallbacksRunning::~RAIICallbacksRunning
          (RAIICallbacksRunning *this)

{
  Mutex *in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_RDI);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)criticalblock9.super_unique_lock._8_8_,
             (AnnotatedMixin<std::mutex> *)criticalblock9.super_unique_lock._M_device,(char *)this,
             unaff_retaddr,(int)((ulong)lVar1 >> 0x20),SUB81((ulong)lVar1 >> 0x18,0));
  *(undefined1 *)((in_RDI->super_mutex).super___mutex_base._M_mutex.__align + 0x50) = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RDI);
  MaybeScheduleProcessQueue((SerialTaskRunner *)criticalblock9.super_unique_lock._M_device);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~RAIICallbacksRunning()
        {
            {
                LOCK(instance->m_callbacks_mutex);
                instance->m_are_callbacks_running = false;
            }
            instance->MaybeScheduleProcessQueue();
        }